

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O0

int64_t atol8(char *p,size_t char_cnt)

{
  ulong uStack_20;
  int digit;
  int64_t l;
  size_t char_cnt_local;
  char *p_local;
  
  uStack_20 = 0;
  l = char_cnt;
  for (char_cnt_local = (size_t)p;
      ((l != 0 && ('/' < *(char *)char_cnt_local)) && (*(char *)char_cnt_local < '8'));
      char_cnt_local = char_cnt_local + 1) {
    uStack_20 = (long)(*(char *)char_cnt_local + -0x30) | uStack_20 << 3;
    l = l + -1;
  }
  return uStack_20;
}

Assistant:

static int64_t
atol8(const char *p, size_t char_cnt)
{
	int64_t l;
	int digit;
        
	l = 0;
	while (char_cnt-- > 0) {
		if (*p >= '0' && *p <= '7')
			digit = *p - '0';
		else
			break;
		p++;
		l <<= 3;
		l |= digit;
	}
	return (l);
}